

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O0

void absl::StrAppend(Nonnull<std::string_*> dest,AlphaNum *a,AlphaNum *b)

{
  bool bVar1;
  size_type sVar2;
  Nullable<const_char_*> pcVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  string *dest_00;
  Nonnull<char_*> pcVar7;
  long lVar8;
  ulong in_RDI;
  char *out;
  char *begin;
  size_type old_size;
  size_t in_stack_ffffffffffffff78;
  AlphaNum *in_stack_ffffffffffffff98;
  Nullable<const_char_*> in_stack_ffffffffffffffa0;
  
  sVar2 = AlphaNum::size((AlphaNum *)0x3a66f3);
  bVar1 = true;
  if (sVar2 != 0) {
    pcVar3 = AlphaNum::data((AlphaNum *)0x3a670c);
    lVar4 = std::__cxx11::string::data();
    uVar5 = std::__cxx11::string::size();
    bVar1 = uVar5 < (ulong)((long)pcVar3 - lVar4);
  }
  if (!bVar1) {
    __assert_fail("((a).size() == 0) || (uintptr_t((a).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                  ,0xc6,
                  "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &)"
                 );
  }
  sVar2 = AlphaNum::size((AlphaNum *)0x3a6782);
  bVar1 = true;
  if (sVar2 != 0) {
    in_stack_ffffffffffffffa0 = AlphaNum::data((AlphaNum *)0x3a679b);
    lVar4 = std::__cxx11::string::data();
    uVar5 = (long)in_stack_ffffffffffffffa0 - lVar4;
    uVar6 = std::__cxx11::string::size();
    bVar1 = uVar6 < uVar5;
  }
  if (!bVar1) {
    __assert_fail("((b).size() == 0) || (uintptr_t((b).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                  ,199,
                  "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &)"
                 );
  }
  std::__cxx11::string::size();
  dest_00 = (string *)AlphaNum::size((AlphaNum *)0x3a6830);
  AlphaNum::size((AlphaNum *)0x3a683f);
  anon_unknown_5::STLStringAppendUninitializedAmortized(dest_00,in_stack_ffffffffffffff78);
  lVar4 = std::__cxx11::string::operator[](in_RDI);
  anon_unknown_5::Append(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  pcVar7 = anon_unknown_5::Append(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  lVar8 = std::__cxx11::string::size();
  if (pcVar7 == (Nonnull<char_*>)(lVar4 + lVar8)) {
    return;
  }
  __assert_fail("out == begin + dest->size()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                ,0xce,
                "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &)"
               );
}

Assistant:

void StrAppend(absl::Nonnull<std::string*> dest, const AlphaNum& a,
               const AlphaNum& b) {
  ASSERT_NO_OVERLAP(*dest, a);
  ASSERT_NO_OVERLAP(*dest, b);
  std::string::size_type old_size = dest->size();
  STLStringAppendUninitializedAmortized(dest, a.size() + b.size());
  char* const begin = &(*dest)[0];
  char* out = begin + old_size;
  out = Append(out, a);
  out = Append(out, b);
  assert(out == begin + dest->size());
}